

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O2

QDebug __thiscall
QtPrivate::printSequentialContainer<QList<Qt::Key>>
          (QtPrivate *this,QDebug debug,char *which,QList<Qt::Key> *c)

{
  long lVar1;
  long lVar2;
  undefined8 uVar3;
  QDebug *pQVar4;
  Key *pKVar5;
  QDebug dbg;
  Key *pKVar6;
  long in_FS_OFFSET;
  QDebug local_60 [2];
  QDebug local_50;
  undefined1 local_48 [8];
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  _saver = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)debug.stream);
  *(undefined1 *)(*(long *)debug.stream + 0x30) = 0;
  pQVar4 = QDebug::operator<<((QDebug *)debug.stream,which);
  QDebug::operator<<(pQVar4,'(');
  pKVar6 = (c->d).ptr;
  lVar2 = (c->d).size;
  pKVar5 = pKVar6 + lVar2;
  if (lVar2 == 0) goto LAB_002de571;
  local_50.stream = *debug.stream;
  pQVar4 = &local_50;
  (local_50.stream)->ref = (local_50.stream)->ref + 1;
  dbg.stream = (Stream *)local_48;
  while( true ) {
    ::operator<<(dbg,(Key)pQVar4);
    QDebug::~QDebug((QDebug *)dbg.stream);
    QDebug::~QDebug(pQVar4);
    pKVar6 = pKVar6 + 1;
LAB_002de571:
    if (pKVar6 == pKVar5) break;
    pQVar4 = QDebug::operator<<((QDebug *)debug.stream,", ");
    local_60[0].stream = pQVar4->stream;
    pQVar4 = local_60;
    (local_60[0].stream)->ref = (local_60[0].stream)->ref + 1;
    dbg.stream = (Stream *)(local_60 + 1);
  }
  QDebug::operator<<((QDebug *)debug.stream,')');
  uVar3 = *(undefined8 *)debug.stream;
  *(undefined8 *)debug.stream = 0;
  *(undefined8 *)this = uVar3;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)(Stream *)this;
  }
  __stack_chk_fail();
}

Assistant:

inline QDebug printSequentialContainer(QDebug debug, const char *which, const SequentialContainer &c)
{
    const QDebugStateSaver saver(debug);
    debug.nospace() << which << '(';
    typename SequentialContainer::const_iterator it = c.begin(), end = c.end();
    if (it != end) {
        debug << *it;
        ++it;
    }
    while (it != end) {
        debug << ", " << *it;
        ++it;
    }
    debug << ')';
    return debug;
}